

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O3

void __thiscall SQFile::~SQFile(SQFile *this)

{
  (this->super_SQStream)._vptr_SQStream = (_func_int **)&PTR__SQFile_0010f630;
  if (((FILE *)this->_handle != (FILE *)0x0) && (this->_owns == true)) {
    fclose((FILE *)this->_handle);
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

virtual ~SQFile() { Close(); }